

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O0

char * dict_to_string(ObjDict *dict)

{
  HTItem **ppHVar1;
  char *pcVar2;
  undefined8 *puVar3;
  CrispyValue value;
  String *s;
  long lStack_80;
  uint32_t j;
  size_t offset;
  char *string;
  char *val;
  char *key;
  HTItem *bucket;
  uint32_t i;
  _Bool first;
  size_t temp_size;
  size_t size;
  StringArray str_arr;
  HashTable ht;
  ObjDict *dict_local;
  
  str_arr.strings = *(String **)&dict->content;
  ppHVar1 = (dict->content).buckets;
  init_string_array((StringArray *)&size);
  temp_size = 0;
  bucket._7_1_ = 1;
  for (bucket._0_4_ = 0; (uint)bucket < str_arr.strings._4_4_; bucket._0_4_ = (uint)bucket + 1) {
    for (key = (char *)ppHVar1[(uint)bucket]; key != (char *)0x0; key = *(char **)(key + 0x20)) {
      if ((bucket._7_1_ & 1) == 0) {
        pcVar2 = strdup(", \"");
        write_string((StringArray *)&size,pcVar2,3);
        temp_size = temp_size + 3;
      }
      else {
        bucket._7_1_ = 0;
        pcVar2 = strdup("\"");
        write_string((StringArray *)&size,pcVar2,1);
        temp_size = temp_size + 1;
      }
      _i = ht_key_to_string((HTKeyType)str_arr.strings,(HTItemKey)*key,&val);
      write_string((StringArray *)&size,val,_i);
      temp_size = _i + temp_size + 3;
      pcVar2 = strdup("\": ");
      write_string((StringArray *)&size,pcVar2,3);
      value._4_4_ = 0;
      value.type = *(uint *)(key + 0x10);
      value.field_1.p_value = ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(key + 0x18))->p_value;
      _i = value_to_string(value,&string);
      write_string((StringArray *)&size,string,_i);
      temp_size = _i + temp_size;
    }
  }
  pcVar2 = (char *)malloc(temp_size + 3);
  lStack_80 = 1;
  for (s._4_4_ = 0; s._4_4_ < (uint)size; s._4_4_ = s._4_4_ + 1) {
    puVar3 = (undefined8 *)(str_arr._0_8_ + (ulong)s._4_4_ * 0x10);
    memcpy(pcVar2 + lStack_80,(void *)*puVar3,puVar3[1]);
    free(*(void **)(str_arr._0_8_ + (ulong)s._4_4_ * 0x10));
    lStack_80 = puVar3[1] + lStack_80;
  }
  *pcVar2 = '{';
  pcVar2[temp_size + 1] = '}';
  pcVar2[temp_size + 2] = '\0';
  free_string_array((StringArray *)&size);
  return pcVar2;
}

Assistant:

char *dict_to_string(ObjDict *dict) {
    HashTable ht = dict->content;
    StringArray str_arr;
    init_string_array(&str_arr);

    size_t size = 0;
    size_t temp_size;

    bool first = true;

    for (uint32_t i = 0; i < ht.cap; ++i) {
        HTItem *bucket = ht.buckets[i];
        while (bucket) {
            if (first) {
                first = false;
                write_string(&str_arr, strdup("\""), 1);
                size += 1;
            } else {
                write_string(&str_arr, strdup(", \""), 3);
                size += 3;
            }

            char *key;
            temp_size = ht_key_to_string(ht.key_type, bucket->key, &key);
            write_string(&str_arr, key, temp_size);
            size += temp_size;

            size += 3;
            write_string(&str_arr, strdup("\": "), 3);

            char *val;
            temp_size = value_to_string(bucket->value, &val);
            write_string(&str_arr, val, temp_size);
            size += temp_size;

            bucket = bucket->next;
        }
    }

    char *string = malloc((size + 3)* sizeof(char));
    size_t offset = 1;

    for (uint32_t j = 0; j < str_arr.count; ++j) {
        String *s = &str_arr.strings[j];
        memcpy(string + offset, s->start, s->length);
        free(str_arr.strings[j].start);
        offset += s->length;
    }

    string[0] = '{';
    string[size + 1] = '}';
    string[size + 2] = '\0';

    free_string_array(&str_arr);

    return string;
}